

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *filename;
  char *filename_00;
  FILE *pFVar1;
  _Bool _Var2;
  clock_t cVar3;
  plutosvg_document_t *document_00;
  clock_t cVar4;
  clock_t end;
  clock_t start;
  plutovg_surface_t *surface;
  plutosvg_document_t *document;
  char *id;
  char *output;
  char *input;
  char **argv_local;
  int argc_local;
  
  if ((argc == 3) || (argc == 4)) {
    filename = argv[1];
    filename_00 = argv[2];
    document = (plutosvg_document_t *)0x0;
    if (argc == 4) {
      document = (plutosvg_document_t *)argv[3];
    }
    start = 0;
    cVar3 = clock();
    document_00 = plutosvg_document_load_from_file(filename,-1.0,-1.0);
    cVar4 = clock();
    pFVar1 = _stdout;
    if (document_00 == (plutosvg_document_t *)0x0) {
      fprintf(_stderr,"Unable to load \'%s\'\n",filename);
    }
    else {
      elapsed_time(cVar3,cVar4);
      fprintf(pFVar1,"Finished loading \'%s\' in %.3f seconds\n",filename);
      cVar3 = clock();
      start = (clock_t)plutosvg_document_render_to_surface
                                 (document_00,(char *)document,-1,-1,(plutovg_color_t *)0x0,
                                  (plutosvg_palette_func_t)0x0,(void *)0x0);
      cVar4 = clock();
      pFVar1 = _stdout;
      if ((plutovg_surface_t *)start == (plutovg_surface_t *)0x0) {
        fprintf(_stderr,"Unable to render \'%s\'\n",filename);
      }
      else {
        elapsed_time(cVar3,cVar4);
        fprintf(pFVar1,"Finished rendering \'%s\' in %.3f seconds\n",filename);
        cVar3 = clock();
        _Var2 = plutovg_surface_write_to_png((plutovg_surface_t *)start,filename_00);
        if (_Var2) {
          cVar4 = clock();
          pFVar1 = _stdout;
          elapsed_time(cVar3,cVar4);
          fprintf(pFVar1,"Finished writing \'%s\' in %.3f seconds\n",filename_00);
        }
        else {
          fprintf(_stderr,"Unable to write \'%s\'\n",filename_00);
        }
      }
    }
    plutovg_surface_destroy((plutovg_surface_t *)start);
    plutosvg_document_destroy(document_00);
    argv_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Usage: svg2png input output [id]\n");
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc != 3 && argc != 4) {
        fprintf(stderr, "Usage: svg2png input output [id]\n");
        return -1;
    }

    const char* input = argv[1];
    const char* output = argv[2];
    const char* id = NULL;
    if(argc == 4) {
        id = argv[3];
    }

    plutosvg_document_t* document = NULL;
    plutovg_surface_t* surface = NULL;
    clock_t start, end;

    start = clock();
    document = plutosvg_document_load_from_file(input, -1, -1);
    end = clock();

    if(document == NULL) {
        fprintf(stderr, "Unable to load '%s'\n", input);
        goto cleanup;
    }

    fprintf(stdout, "Finished loading '%s' in %.3f seconds\n", input, elapsed_time(start, end));

    start = clock();
    surface = plutosvg_document_render_to_surface(document, id, -1, -1, NULL, NULL, NULL);
    end = clock();

    if(surface == NULL) {
        fprintf(stderr, "Unable to render '%s'\n", input);
        goto cleanup;
    }

    fprintf(stdout, "Finished rendering '%s' in %.3f seconds\n", input, elapsed_time(start, end));

    start = clock();
    if(!plutovg_surface_write_to_png(surface, output)) {
        fprintf(stderr, "Unable to write '%s'\n", output);
        goto cleanup;
    }
    end = clock();

    fprintf(stdout, "Finished writing '%s' in %.3f seconds\n", output, elapsed_time(start, end));
cleanup:
    plutovg_surface_destroy(surface);
    plutosvg_document_destroy(document);
    return 0;
}